

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_group.hpp
# Opt level: O0

void __thiscall
oqpi::
parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
::oneTaskDone(parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
              *this)

{
  scheduler<concurrent_queue> *hTask;
  bool bVar1;
  reference pvVar2;
  task_handle local_98;
  undefined1 local_88 [24];
  size_t i;
  size_type taskCount;
  __int_type_conflict previousTaskCount;
  parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
  *this_local;
  undefined8 local_50;
  undefined4 local_44;
  undefined8 local_40;
  undefined8 local_38;
  _Map_pointer local_30;
  size_t local_28;
  undefined4 local_1c;
  _Elt_pointer local_18;
  atomic<unsigned_long> *local_10;
  
  local_10 = &this->activeTasksCount_;
  local_18 = (_Elt_pointer)0x1;
  local_1c = 5;
  local_28 = 1;
  LOCK();
  taskCount = (local_10->super___atomic_base<unsigned_long>)._M_i;
  (local_10->super___atomic_base<unsigned_long>)._M_i =
       (local_10->super___atomic_base<unsigned_long>)._M_i - 1;
  UNLOCK();
  previousTaskCount = (__int_type_conflict)this;
  local_30 = (_Map_pointer)taskCount;
  if ((_Map_pointer)taskCount == (_Map_pointer)0x1) {
    task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
    ::notifyGroupDone(&this->
                       super_task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
                     );
  }
  else if (0 < this->maxSimultaneousTasks_) {
    i = std::vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>::size(&this->tasks_);
    do {
      do {
        local_38 = &this->currentTaskIndex_;
        local_40 = (__pthread_internal_list *)0x1;
        local_44 = 5;
        local_50 = 1;
        LOCK();
        local_88._16_8_ =
             (((atomic<unsigned_long> *)local_38)->super___atomic_base<unsigned_long>)._M_i;
        (((atomic<unsigned_long> *)local_38)->super___atomic_base<unsigned_long>)._M_i =
             (((atomic<unsigned_long> *)local_38)->super___atomic_base<unsigned_long>)._M_i + 1;
        UNLOCK();
        if (i <= (ulong)local_88._16_8_) {
          return;
        }
        this_local = (parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
                      *)local_88._16_8_;
        pvVar2 = std::vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>::operator[]
                           (&this->tasks_,local_88._16_8_);
        bVar1 = task_handle::isGrabbed(pvVar2);
      } while (bVar1);
      pvVar2 = std::vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>::operator[]
                         (&this->tasks_,local_88._16_8_);
      bVar1 = task_handle::isDone(pvVar2);
    } while (bVar1);
    hTask = (this->
            super_task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
            ).scheduler_;
    pvVar2 = std::vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>::operator[]
                       (&this->tasks_,local_88._16_8_);
    task_handle::task_handle(&local_98,pvVar2);
    scheduler<concurrent_queue>::add((scheduler<concurrent_queue> *)local_88,(task_handle *)hTask);
    task_handle::~task_handle((task_handle *)local_88);
    task_handle::~task_handle(&local_98);
  }
  return;
}

Assistant:

virtual void oneTaskDone() override final
        {
            const auto previousTaskCount = activeTasksCount_.fetch_sub(1);
            if (previousTaskCount == 1)
            {
                this->notifyGroupDone();
            }
            else if (maxSimultaneousTasks_ > 0)
            {
                const auto taskCount = tasks_.size();
                size_t i = 0;
                while ((i = currentTaskIndex_.fetch_add(1)) < taskCount)
                {
                    if (!tasks_[i].isGrabbed() && !tasks_[i].isDone())
                    {
                        this->scheduler_.add(tasks_[i]);
                        break;
                    }
                }
            }
        }